

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component,
          Deduplicator *deduplicator)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  DeduplicateStatus DVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  cmValue cVar7;
  uint uVar8;
  pointer __rhs;
  char local_28a;
  allocator<char> local_289;
  cmValue local_288 [4];
  cmArchiveWrite *local_268;
  pointer local_260;
  Deduplicator *local_258;
  string filePrefix;
  string rp;
  cmWorkingDirectory workdir;
  string localToplevel;
  ostringstream cmCPackLog_msg;
  string local_50;
  
  local_268 = archive;
  local_258 = deduplicator;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"   - packaging component: ");
  poVar4 = std::operator<<(poVar4,(string *)component);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xea,workdir.OldDir._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&workdir);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&workdir);
  psVar5 = (string *)
           cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&localToplevel,(string *)psVar5);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&component->Name);
  std::__cxx11::string::append((string *)&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  cmWorkingDirectory::cmWorkingDirectory(&workdir,&localToplevel);
  if (workdir.ResultCode == 0) {
    filePrefix._M_dataplus._M_p = (pointer)&filePrefix.field_2;
    filePrefix._M_string_length = 0;
    filePrefix.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",
               (allocator<char> *)&rp);
    bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rp,"CPACK_PACKAGE_FILE_NAME",&local_289);
      local_288[0] = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&rp);
      local_28a = '/';
      cmStrCat<cmValue,char>((string *)&cmCPackLog_msg,local_288,&local_28a);
      std::__cxx11::string::operator=((string *)&filePrefix,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&rp);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGING_INSTALL_PREFIX",(allocator<char> *)&rp);
    cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (((cVar7.Value != (string *)0x0) && (1 < (cVar7.Value)->_M_string_length)) &&
       (*((cVar7.Value)->_M_dataplus)._M_p == '/')) {
      std::__cxx11::string::substr((ulong)&cmCPackLog_msg,(ulong)cVar7.Value);
      std::__cxx11::string::append((string *)&filePrefix);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::append((char *)&filePrefix);
    }
    local_260 = (component->Files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = (component->Files).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != local_260; __rhs = __rhs + 1) {
      std::operator+(&rp,&filePrefix,__rhs);
      if (local_258 != (Deduplicator *)0x0) {
        DVar3 = Deduplicator::IsDeduplicate(local_258,&rp,&localToplevel);
        if (DVar3 == Add) goto LAB_001b8173;
        if (DVar3 != Error) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Passing file: ");
          poVar4 = std::operator<<(poVar4,(string *)&rp);
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x114,(char *)local_288[0].Value);
          std::__cxx11::string::~string((string *)local_288);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          goto LAB_001b820b;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        std::operator<<((ostream *)&cmCPackLog_msg,
                        "ERROR The data in files with the same filename is different.");
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x110,(char *)local_288[0].Value);
LAB_001b8313:
        std::__cxx11::string::~string((string *)local_288);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&rp);
        break;
      }
LAB_001b8173:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Adding file: ");
      poVar4 = std::operator<<(poVar4,(string *)&rp);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x10b,(char *)local_288[0].Value);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::string((string *)&local_50,(string *)&rp);
      cmArchiveWrite::Add(local_268,&local_50,0,(char *)0x0,false);
      std::__cxx11::string::~string((string *)&local_50);
LAB_001b820b:
      if ((local_268->Error)._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"ERROR while packaging files: ");
        std::__cxx11::string::string((string *)local_288,(string *)&local_268->Error);
        poVar4 = std::operator<<(poVar4,(string *)local_288);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_288);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x11a,(char *)local_288[0].Value);
        goto LAB_001b8313;
      }
      std::__cxx11::string::~string((string *)&rp);
    }
    uVar8 = (uint)(__rhs == local_260);
    std::__cxx11::string::~string((string *)&filePrefix);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Failed to change working directory to ");
    poVar4 = std::operator<<(poVar4,(string *)&localToplevel);
    poVar4 = std::operator<<(poVar4," : ");
    pcVar6 = strerror(workdir.ResultCode);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xf4,filePrefix._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&filePrefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar8 = 0;
  }
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  std::__cxx11::string::~string((string *)&localToplevel);
  return uVar8;
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(
  cmArchiveWrite& archive, cmCPackComponent* component,
  Deduplicator* deduplicator)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "   - packaging component: " << component->Name << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/" + component->Name;
  // Change to local toplevel
  cmWorkingDirectory workdir(localToplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << localToplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
    filePrefix = cmStrCat(this->GetOption("CPACK_PACKAGE_FILE_NAME"), '/');
  }
  cmValue installPrefix = this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if (installPrefix && installPrefix->size() > 1 &&
      (*installPrefix)[0] == '/') {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix->substr(1);
    filePrefix += "/";
  }
  for (std::string const& file : component->Files) {
    std::string rp = filePrefix + file;

    DeduplicateStatus status = DeduplicateStatus::Add;
    if (deduplicator != nullptr) {
      status = deduplicator->IsDeduplicate(rp, localToplevel);
    }

    if (deduplicator == nullptr || status == DeduplicateStatus::Add) {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Adding file: " << rp << std::endl);
      archive.Add(rp, 0, nullptr, false);
    } else if (status == DeduplicateStatus::Error) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR The data in files with the "
                    "same filename is different.");
      return 0;
    } else {
      cmCPackLogger(cmCPackLog::LOG_DEBUG,
                    "Passing file: " << rp << std::endl);
    }

    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR while packaging files: " << archive.GetError()
                                                    << std::endl);
      return 0;
    }
  }
  return 1;
}